

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O0

void lj_cdata_setfin(lua_State *L,GCcdata *cd,GCobj *obj,uint32_t it)

{
  TValue *pTVar1;
  cTValue local_110;
  TValue tmp;
  TValue *tv;
  GCtab *t;
  GCobj *pGStack_f0;
  uint32_t it_local;
  GCobj *obj_local;
  GCcdata *cd_local;
  lua_State *L_local;
  cTValue *local_d0;
  lua_State *local_c8;
  GCobj *local_c0;
  GCobj *o;
  uint64_t local_b0;
  undefined4 local_a4;
  GCcdata *local_a0;
  cTValue *local_98;
  lua_State *local_90;
  undefined4 local_4c;
  GCcdata *local_48;
  cTValue *local_40;
  char *local_20;
  cTValue *local_18;
  lua_State *local_10;
  
  tv = *(TValue **)(*(long *)((L->glref).ptr64 + 0x180) + 0x20);
  if (((GCRef *)&((lua_State *)tv)->base)->gcptr64 != 0) {
    local_d0 = &local_110;
    local_a4 = 0xfffffff5;
    local_4c = 0xfffffff5;
    local_110.u64 = (ulong)cd | 0xfffa800000000000;
    local_20 = "store to dead GC object";
    if ((((GChead *)tv)->marked & 4) != 0) {
      local_b0 = (L->glref).ptr64;
      ((GChead *)tv)->marked = ((GChead *)tv)->marked & 0xfb;
      (((GChead *)tv)->gclist).gcptr64 = *(uint64_t *)(local_b0 + 0x40);
      *(TValue **)(local_b0 + 0x40) = tv;
      local_c0 = (GCobj *)tv;
      o = (GCobj *)tv;
    }
    t._4_4_ = it;
    pGStack_f0 = obj;
    obj_local = (GCobj *)cd;
    cd_local = (GCcdata *)L;
    L_local = (lua_State *)cd;
    local_c8 = L;
    local_a0 = cd;
    local_98 = local_d0;
    local_90 = L;
    local_48 = cd;
    local_40 = local_d0;
    local_18 = local_d0;
    local_10 = L;
    pTVar1 = lj_tab_set(L,(GCtab *)&tv->gcr,&local_110);
    if (t._4_4_ == 0xffffffff) {
      pTVar1->u64 = 0xffffffffffffffff;
      (obj_local->gch).marked = (obj_local->gch).marked & 0xef;
    }
    else {
      pTVar1->u64 = (ulong)pGStack_f0 | (ulong)t._4_4_ << 0x2f;
      (obj_local->gch).marked = (obj_local->gch).marked | 0x10;
    }
  }
  return;
}

Assistant:

void lj_cdata_setfin(lua_State *L, GCcdata *cd, GCobj *obj, uint32_t it)
{
  GCtab *t = ctype_ctsG(G(L))->finalizer;
  if (gcref(t->metatable)) {
    /* Add cdata to finalizer table, if still enabled. */
    TValue *tv, tmp;
    setcdataV(L, &tmp, cd);
    lj_gc_anybarriert(L, t);
    tv = lj_tab_set(L, t, &tmp);
    if (it == LJ_TNIL) {
      setnilV(tv);
      cd->marked &= ~LJ_GC_CDATA_FIN;
    } else {
      setgcV(L, tv, obj, it);
      cd->marked |= LJ_GC_CDATA_FIN;
    }
  }
}